

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSplit.c
# Opt level: O3

DdNode * selectMintermsFromUniverse(DdManager *manager,int *varSeen,double n)

{
  int *piVar1;
  int iVar2;
  DdNode **vars;
  DdNode *pDVar3;
  DdNode *pDVar4;
  uint numVars;
  long lVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  
  iVar2 = manager->size;
  numVars = 0;
  uVar8 = (ulong)(iVar2 - 1);
  if (0 < iVar2) {
    do {
      numVars = numVars + (varSeen[uVar8] == 0);
      bVar9 = uVar8 != 0;
      uVar8 = uVar8 - 1;
    } while (bVar9);
  }
  pDVar4 = manager->one;
  vars = (DdNode **)malloc((long)(int)numVars << 3);
  if (vars == (DdNode **)0x0) {
    manager->errorCode = CUDD_MEMORY_OUT;
    pDVar4 = (DdNode *)0x0;
  }
  else {
    if (0 < iVar2) {
      iVar7 = 0;
      lVar5 = (ulong)(iVar2 - 1) + 1;
      do {
        if (varSeen[lVar5 + -1] == 0) {
          pDVar3 = cuddUniqueInter(manager,manager->perm[lVar5 + -1],pDVar4,
                                   (DdNode *)((ulong)pDVar4 ^ 1));
          vars[iVar7] = pDVar3;
          piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          iVar7 = iVar7 + 1;
        }
        lVar6 = lVar5 + -1;
        bVar9 = 0 < lVar5;
        lVar5 = lVar6;
      } while (lVar6 != 0 && bVar9);
    }
    pDVar4 = mintermsFromUniverse(manager,vars,numVars,n,0);
    if (pDVar4 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
    }
    if (0 < (int)numVars) {
      uVar8 = 0;
      do {
        Cudd_RecursiveDeref(manager,vars[uVar8]);
        uVar8 = uVar8 + 1;
      } while (numVars != uVar8);
    }
    free(vars);
  }
  return pDVar4;
}

Assistant:

static DdNode *
selectMintermsFromUniverse(
  DdManager * manager,
  int * varSeen,
  double  n)
{
    int numVars;
    int i, size, j;
     DdNode *one, *zero, *result;
    DdNode **vars;

    numVars = 0;
    size = manager->size;
    one = DD_ONE(manager);
    zero = Cudd_Not(one);

    /* Count the number of variables not encountered so far in procedure
    ** cuddSplitSetRecur.
    */
    for (i = size-1; i >= 0; i--) {
        if(varSeen[i] == 0)
            numVars++;
    }
    vars = ABC_ALLOC(DdNode *, numVars);
    if (!vars) {
        manager->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }

    j = 0;
    for (i = size-1; i >= 0; i--) {
        if(varSeen[i] == 0) {
            vars[j] = cuddUniqueInter(manager,manager->perm[i],one,zero);
            cuddRef(vars[j]);
            j++;
        }
    }

    /* Compute a function which has n minterms and depends on at most
    ** numVars variables.
    */
    result = mintermsFromUniverse(manager,vars,numVars,n, 0);
    if (result) 
        cuddRef(result);

    for (i = 0; i < numVars; i++)
        Cudd_RecursiveDeref(manager,vars[i]);
    ABC_FREE(vars);

    return(result);

}